

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

AffineSpace3fa * __thiscall
embree::XMLLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (AffineSpace3fa *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *pXVar2;
  Token *this_00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [8];
  _Alloc_hider _Var8;
  int iVar9;
  int iVar10;
  runtime_error *this_01;
  long *plVar11;
  size_type *psVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 extraout_XMM0_Dd;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float fVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  float fVar25;
  float fVar26;
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  float fVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  Vec3f v;
  Vec3f p;
  string local_258;
  undefined1 local_238 [8];
  float local_230;
  char local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  float local_1e8;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  float local_118;
  float local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar28 [16];
  
  pXVar2 = xml->ptr;
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"translate","");
  XML::parm(&local_258,pXVar2,(string *)local_238);
  iVar9 = std::__cxx11::string::compare((char *)&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238);
  }
  if (iVar9 != 0) {
    pXVar2 = xml->ptr;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"translate","");
    XML::parm(&local_70,pXVar2,&local_258);
    string_to_Vec3f((embree *)local_238,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    aVar21.m128[2] = local_230;
    aVar21._0_8_ = local_238;
    aVar21.m128[3] = 0.0;
    aVar17._0_12_ = ZEXT812(0x3f800000);
    aVar17.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 = aVar17;
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = 0x3f80000000000000;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = 0x3f800000;
    (__return_storage_ptr__->p).field_0 = aVar21;
    return __return_storage_ptr__;
  }
  pXVar2 = xml->ptr;
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"scale","");
  XML::parm(&local_258,pXVar2,(string *)local_238);
  iVar9 = std::__cxx11::string::compare((char *)&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238);
  }
  if (iVar9 != 0) {
    pXVar2 = xml->ptr;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"scale","");
    XML::parm(&local_90,pXVar2,&local_258);
    string_to_Vec3f((embree *)local_238,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    auVar7 = local_238;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
      auVar7 = local_238;
    }
    local_238._4_4_ = (undefined4)((ulong)auVar7 >> 0x20);
    local_238._0_4_ = SUB84(auVar7,0);
    aVar33._0_12_ = ZEXT812(0);
    aVar33.m128[3] = 0.0;
    (__return_storage_ptr__->l).vx.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT416((uint)local_238._0_4_);
    (__return_storage_ptr__->l).vy.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)local_238._4_4_) << 0x20);
    (__return_storage_ptr__->l).vz.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)(ZEXT416((uint)local_230) << 0x40);
    (__return_storage_ptr__->p).field_0 = aVar33;
    return __return_storage_ptr__;
  }
  pXVar2 = xml->ptr;
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_x","");
  XML::parm(&local_258,pXVar2,(string *)local_238);
  iVar9 = std::__cxx11::string::compare((char *)&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238);
  }
  if (iVar9 == 0) {
LAB_00179be8:
    pXVar2 = xml->ptr;
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_y","");
    XML::parm(&local_258,pXVar2,(string *)local_238);
    iVar9 = std::__cxx11::string::compare((char *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238);
    }
    if (iVar9 == 0) {
      pXVar2 = xml->ptr;
      local_238 = (undefined1  [8])local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_z","");
      XML::parm(&local_258,pXVar2,(string *)local_238);
      iVar9 = std::__cxx11::string::compare((char *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      if (iVar9 != 0) {
        pXVar2 = xml->ptr;
        local_238 = (undefined1  [8])local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_z","");
        XML::parm(&local_258,pXVar2,(string *)local_238);
        _Var8._M_p = local_258._M_dataplus._M_p;
        xml = (Ref<embree::XML> *)__errno_location();
        iVar9 = *(int *)&xml->ptr;
        *(int *)&xml->ptr = 0;
        fVar15 = strtof(_Var8._M_p,(char **)&local_1b8);
        local_218._0_4_ = fVar15;
        if (local_1b8._M_dataplus._M_p != _Var8._M_p) {
          if (*(int *)&xml->ptr == 0) {
            *(int *)&xml->ptr = iVar9;
          }
          else if (*(int *)&xml->ptr == 0x22) {
            std::__throw_out_of_range("stof");
            goto LAB_00179e4d;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          if (local_238 != (undefined1  [8])local_228) {
            operator_delete((void *)local_238);
          }
          fVar15 = (float)local_218._0_4_ * 0.017453292;
          local_218._0_4_ = fVar15;
          auVar27._0_12_ = ZEXT812(0x3f800000);
          auVar27._12_4_ = 0;
          auVar19 = rsqrtss(auVar27,auVar27);
          fVar16 = auVar19._0_4_;
          fVar16 = fVar16 * fVar16 * fVar16 * -0.5 + fVar16 * 1.5;
          local_208._4_4_ = fVar16 * 0.0;
          uStack_200._0_4_ = fVar16 * 1.0;
          goto LAB_0017a043;
        }
        goto LAB_0017abd0;
      }
      pXVar2 = xml->ptr;
      local_238 = (undefined1  [8])local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"angle","");
      XML::parm(&local_258,pXVar2,(string *)local_238);
      iVar9 = std::__cxx11::string::compare((char *)&local_258);
      if (iVar9 == 0) {
LAB_0017a1b9:
        bVar14 = false;
        bVar13 = false;
      }
      else {
        pXVar2 = xml->ptr;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"axis","");
        XML::parm(&local_1b8,pXVar2,&local_178);
        iVar10 = std::__cxx11::string::compare((char *)&local_1b8);
        if (iVar10 == 0) goto LAB_0017a1b9;
        pXVar2 = xml->ptr;
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"point","");
        XML::parm(&local_50,pXVar2,&local_138);
        iVar10 = std::__cxx11::string::compare((char *)&local_50);
        bVar13 = iVar10 != 0;
        bVar14 = true;
      }
      if (bVar14) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      if (iVar9 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      if (bVar13) {
        pXVar2 = xml->ptr;
        local_238 = (undefined1  [8])local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"angle","");
        XML::parm(&local_258,pXVar2,(string *)local_238);
        fVar15 = std::__cxx11::stof(&local_258,(size_t *)0x0);
        local_218._0_4_ = fVar15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if (local_238 != (undefined1  [8])local_228) {
          operator_delete((void *)local_238);
        }
        pXVar2 = xml->ptr;
        paVar1 = &local_258.field_2;
        local_258._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"axis","");
        XML::parm(&local_b0,pXVar2,&local_258);
        string_to_Vec3f((embree *)local_238,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != paVar1) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        pXVar2 = xml->ptr;
        local_258._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"point","");
        XML::parm(&local_d0,pXVar2,&local_258);
        string_to_Vec3f((embree *)&local_198,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        auVar7 = local_238;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != paVar1) {
          operator_delete(local_258._M_dataplus._M_p);
          auVar7 = local_238;
        }
        local_238._4_4_ = (undefined4)((ulong)auVar7 >> 0x20);
        local_238._0_4_ = SUB84(auVar7,0);
        local_208._4_4_ = (undefined4)local_198._M_string_length;
        local_208._0_4_ = local_198._M_dataplus._M_p._4_4_;
        uStack_200 = 0;
        local_1f8 = ZEXT416((uint)local_198._M_dataplus._M_p);
        local_1d8._4_4_ = local_198._M_dataplus._M_p._4_4_;
        local_1d8._0_4_ = (uint)local_198._M_dataplus._M_p;
        fStack_1d0 = (float)(undefined4)local_198._M_string_length;
        fStack_1cc = 0.0;
        fVar15 = (float)local_218._0_4_ * 0.017453292;
        local_218._0_4_ = fVar15;
        fVar16 = (float)local_238._4_4_ * (float)local_238._4_4_;
        fVar24 = local_230 * local_230;
        fVar25 = fVar16 + (float)local_238._0_4_ * (float)local_238._0_4_ + fVar24;
        auVar28._0_8_ = CONCAT44(fVar16 + fVar16 + 0.0,fVar25);
        auVar28._8_4_ = fVar16 + fVar24 + fVar24;
        auVar28._12_4_ = fVar16 + 0.0 + 0.0;
        auVar34._8_4_ = auVar28._8_4_;
        auVar34._0_8_ = auVar28._0_8_;
        auVar34._12_4_ = auVar28._12_4_;
        auVar19 = rsqrtss(auVar34,auVar28);
        fVar16 = auVar19._0_4_;
        fStack_1bc = fVar16 * fVar16 * fVar25 * -0.5 * fVar16 + fVar16 * 1.5;
        local_1c8 = fStack_1bc * (float)local_238._0_4_;
        fStack_1c4 = fStack_1bc * (float)local_238._4_4_;
        fStack_1c0 = fStack_1bc * local_230;
        fStack_1bc = fStack_1bc * 0.0;
        local_238 = auVar7;
        local_1e8 = sinf(fVar15);
        fVar15 = cosf((float)local_218._0_4_);
        fVar16 = (1.0 - local_1c8 * local_1c8) * fVar15 + local_1c8 * local_1c8;
        fVar36 = 1.0 - fVar15;
        fVar39 = local_1c8 * fStack_1c4 * fVar36;
        fVar26 = fVar39 - local_1e8 * fStack_1c0;
        fVar39 = local_1e8 * fStack_1c0 + fVar39;
        fVar40 = (1.0 - fStack_1c4 * fStack_1c4) * fVar15 + fStack_1c4 * fStack_1c4;
        fVar42 = local_1c8 * fStack_1c0 * fVar36;
        fVar36 = fStack_1c4 * fStack_1c0 * fVar36;
        fVar37 = fVar42 + local_1e8 * fStack_1c4;
        fVar42 = fVar42 - local_1e8 * fStack_1c4;
        fVar41 = fVar36 - local_1c8 * local_1e8;
        fVar36 = local_1c8 * local_1e8 + fVar36;
        fVar32 = (1.0 - fStack_1c0 * fStack_1c0) * fVar15 + fStack_1c0 * fStack_1c0;
        fVar15 = fVar16 * 1.0 + fVar39 * 0.0 + fVar42 * 0.0;
        fVar24 = fVar16 * 0.0 + fVar39 * 1.0 + fVar42 * 0.0;
        fVar25 = fVar16 * 0.0 + fVar39 * 0.0 + fVar42 * 1.0;
        fVar16 = fVar16 * 0.0 + fVar39 * 0.0 + fVar42 * 0.0;
        fVar39 = fVar26 * 1.0 + fVar40 * 0.0 + fVar36 * 0.0;
        fVar42 = fVar26 * 0.0 + fVar40 * 1.0 + fVar36 * 0.0;
        fVar31 = fVar26 * 0.0 + fVar40 * 0.0 + fVar36 * 1.0;
        fVar26 = fVar26 * 0.0 + fVar40 * 0.0 + fVar36 * 0.0;
        fVar36 = fVar37 * 1.0 + fVar41 * 0.0 + fVar32 * 0.0;
        fVar40 = fVar37 * 0.0 + fVar41 * 1.0 + fVar32 * 0.0;
        fVar38 = fVar37 * 0.0 + fVar41 * 0.0 + fVar32 * 1.0;
        fVar32 = fVar37 * 0.0 + fVar41 * 0.0 + fVar32 * 0.0;
        (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar39 * 0.0 + fVar36 * 0.0 + fVar15;
        (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar42 * 0.0 + fVar40 * 0.0 + fVar24;
        (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar31 * 0.0 + fVar38 * 0.0 + fVar25;
        (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar26 * 0.0 + fVar32 * 0.0 + fVar16;
        (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar36 * 0.0 + fVar39 + fVar15 * 0.0;
        (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar40 * 0.0 + fVar42 + fVar24 * 0.0;
        (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar38 * 0.0 + fVar31 + fVar25 * 0.0;
        (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar32 * 0.0 + fVar26 + fVar16 * 0.0;
        (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar15 * 0.0 + fVar36 + fVar39 * 0.0;
        (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar24 * 0.0 + fVar40 + fVar42 * 0.0;
        (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar25 * 0.0 + fVar38 + fVar31 * 0.0;
        (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar16 * 0.0 + fVar32 + fVar26 * 0.0;
        (__return_storage_ptr__->p).field_0.m128[0] =
             ((-(float)local_208._0_4_ * fVar39 - (float)local_208._4_4_ * fVar36) -
             (float)local_1f8._0_4_ * fVar15) + (float)local_1d8._0_4_ + 0.0;
        (__return_storage_ptr__->p).field_0.m128[1] =
             ((-(float)local_208._0_4_ * fVar42 - (float)local_208._4_4_ * fVar40) -
             (float)local_1f8._0_4_ * fVar24) + (float)local_1d8._4_4_ + 0.0;
        (__return_storage_ptr__->p).field_0.m128[2] =
             ((-(float)local_208._0_4_ * fVar31 - (float)local_208._4_4_ * fVar38) -
             (float)local_1f8._0_4_ * fVar25) + fStack_1d0 + 0.0;
        (__return_storage_ptr__->p).field_0.m128[3] =
             ((-(float)local_208._0_4_ * fVar26 - (float)local_208._4_4_ * fVar32) -
             (float)local_1f8._0_4_ * fVar16) + fStack_1cc + 0.0;
        return __return_storage_ptr__;
      }
      pXVar2 = xml->ptr;
      local_238 = (undefined1  [8])local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"angle","");
      XML::parm(&local_258,pXVar2,(string *)local_238);
      iVar9 = std::__cxx11::string::compare((char *)&local_258);
      if (iVar9 == 0) {
        bVar14 = false;
      }
      else {
        pXVar2 = xml->ptr;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"axis","");
        XML::parm(&local_198,pXVar2,&local_158);
        iVar9 = std::__cxx11::string::compare((char *)&local_198);
        bVar14 = iVar9 != 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_198._M_dataplus._M_p._4_4_,(uint)local_198._M_dataplus._M_p) !=
            &local_198.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_198._M_dataplus._M_p._4_4_,(uint)local_198._M_dataplus._M_p
                                  ));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      if (!bVar14) {
        this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x360) {
          local_218._0_4_ = Token::Float(this_00,true);
          local_218._4_4_ = extraout_XMM0_Db_01;
          local_218._8_4_ = extraout_XMM0_Dc_01;
          local_218._12_4_ = extraout_XMM0_Dd_01;
          local_1f8._0_4_ =
               Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1,true);
          local_1f8._4_4_ = extraout_XMM0_Db_02;
          local_1f8._8_4_ = extraout_XMM0_Dc_02;
          local_1f8._12_4_ = extraout_XMM0_Dd_02;
          local_208._0_4_ =
               Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 2,true);
          local_208._4_4_ = extraout_XMM0_Db_03;
          uStack_200._0_4_ = (float)extraout_XMM0_Dc_03;
          uStack_200._4_4_ = extraout_XMM0_Dd_03;
          local_1d8._0_4_ =
               Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4,true);
          local_1d8._4_4_ = extraout_XMM0_Db_04;
          fStack_1d0 = (float)extraout_XMM0_Dc_04;
          fStack_1cc = (float)extraout_XMM0_Dd_04;
          local_1e8 = Token::Float((xml->ptr->body).
                                   super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 5,true);
          local_1c8 = Token::Float((xml->ptr->body).
                                   super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 6,true);
          local_108 = Token::Float((xml->ptr->body).
                                   super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 8,true);
          local_118 = Token::Float((xml->ptr->body).
                                   super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 9,true);
          fVar15 = Token::Float((xml->ptr->body).
                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                _M_impl.super__Vector_impl_data._M_start + 10,true);
          local_218._4_4_ = local_1d8._0_4_;
          local_218._8_4_ = local_108;
          local_218._12_4_ = 0;
          local_1f8._4_4_ = local_1e8;
          local_1f8._8_4_ = local_118;
          local_1f8._12_4_ = 0;
          local_208._4_4_ = local_1c8;
          uStack_200._0_4_ = fVar15;
          uStack_200._4_4_ = 0;
          local_1d8._0_4_ =
               Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 3,true);
          local_1d8._4_4_ = extraout_XMM0_Db_05;
          fStack_1d0 = (float)extraout_XMM0_Dc_05;
          fStack_1cc = (float)extraout_XMM0_Dd_05;
          local_1e8 = Token::Float((xml->ptr->body).
                                   super__Vector_base<embree::Token,_std::allocator<embree::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 7,true);
          fVar15 = Token::Float((xml->ptr->body).
                                super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0xb,true);
          aVar30.m128[1] = local_1e8;
          aVar30.m128[0] = (float)local_1d8._0_4_;
          aVar30.m128[2] = fVar15;
          aVar30.m128[3] = 0.0;
          *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = local_218._0_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = local_218._8_8_;
          *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = local_1f8._0_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = local_1f8._8_8_;
          *(undefined1 (*) [8])&(__return_storage_ptr__->l).vz.field_0 = local_208;
          *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_200;
          (__return_storage_ptr__->p).field_0 = aVar30;
          return __return_storage_ptr__;
        }
LAB_0017abdc:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)local_238,&xml->ptr->loc);
        plVar11 = (long *)std::__cxx11::string::append(local_238);
        local_258._M_dataplus._M_p = (pointer)*plVar11;
        psVar12 = (size_type *)(plVar11 + 2);
        if ((size_type *)local_258._M_dataplus._M_p == psVar12) {
          local_258.field_2._M_allocated_capacity = *psVar12;
          local_258.field_2._8_8_ = plVar11[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar12;
        }
        local_258._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::runtime_error::runtime_error(this_01,(string *)&local_258);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pXVar2 = xml->ptr;
      local_238 = (undefined1  [8])local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"angle","");
      XML::parm(&local_258,pXVar2,(string *)local_238);
      fVar15 = std::__cxx11::stof(&local_258,(size_t *)0x0);
      local_218._0_4_ = fVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_238 != (undefined1  [8])local_228) {
        operator_delete((void *)local_238);
      }
      pXVar2 = xml->ptr;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"axis","");
      XML::parm(&local_f0,pXVar2,&local_258);
      string_to_Vec3f((embree *)local_238,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      auVar7 = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
        auVar7 = local_238;
      }
      local_238._4_4_ = (undefined4)((ulong)auVar7 >> 0x20);
      local_238._0_4_ = SUB84(auVar7,0);
      fVar15 = (float)local_218._0_4_ * 0.017453292;
      local_218._0_4_ = fVar15;
      fVar16 = (float)local_238._4_4_ * (float)local_238._4_4_;
      fVar24 = local_230 * local_230;
      fVar25 = fVar16 + (float)local_238._0_4_ * (float)local_238._0_4_ + fVar24;
      auVar29._0_8_ = CONCAT44(fVar16 + fVar16 + 0.0,fVar25);
      auVar29._8_4_ = fVar16 + fVar24 + fVar24;
      auVar29._12_4_ = fVar16 + 0.0 + 0.0;
      auVar35._8_4_ = auVar29._8_4_;
      auVar35._0_8_ = auVar29._0_8_;
      auVar35._12_4_ = auVar29._12_4_;
      auVar19 = rsqrtss(auVar35,auVar29);
      fVar16 = auVar19._0_4_;
      fVar16 = fVar16 * fVar16 * fVar25 * -0.5 * fVar16 + fVar16 * 1.5;
      local_208._4_4_ = fVar16 * (float)local_238._4_4_;
      local_208._0_4_ = fVar16 * (float)local_238._0_4_;
      uStack_200._0_4_ = fVar16 * local_230;
      uStack_200._4_4_ = fVar16 * 0.0;
      local_238 = auVar7;
      local_1f8._0_4_ = sinf(fVar15);
      local_1f8._4_4_ = extraout_XMM0_Db_00;
      local_1f8._8_4_ = extraout_XMM0_Dc_00;
      local_1f8._12_4_ = extraout_XMM0_Dd_00;
      fVar15 = cosf((float)local_218._0_4_);
      aVar23._0_4_ = (1.0 - (float)local_208._0_4_ * (float)local_208._0_4_) * fVar15 +
                     (float)local_208._0_4_ * (float)local_208._0_4_;
      fVar16 = 1.0 - fVar15;
      aVar23.m128[1] =
           (float)local_208._0_4_ * (float)local_208._4_4_ * fVar16 +
           (float)local_1f8._0_4_ * (float)uStack_200;
      aVar23.m128[2] =
           (float)uStack_200 * (float)local_208._0_4_ * fVar16 -
           (float)local_208._4_4_ * (float)local_1f8._0_4_;
      aVar23.m128[3] = 0.0;
      (__return_storage_ptr__->l).vx.field_0 = aVar23;
      aVar4.m128[1] =
           (float)local_208._4_4_ * (float)local_208._4_4_ +
           fVar15 * (1.0 - (float)local_208._4_4_ * (float)local_208._4_4_);
      aVar4.m128[0] =
           fVar16 * (float)local_208._0_4_ * (float)local_208._4_4_ +
           (float)local_1f8._0_4_ * -(float)uStack_200;
      aVar4.m128[2] =
           (float)uStack_200 * (float)local_208._4_4_ * fVar16 +
           (float)local_208._0_4_ * (float)local_1f8._0_4_;
      aVar4.m128[3] = 0.0;
      (__return_storage_ptr__->l).vy.field_0 = aVar4;
      aVar6.m128[1] =
           fVar16 * (float)uStack_200 * (float)local_208._4_4_ +
           -(float)local_208._0_4_ * (float)local_1f8._0_4_;
      aVar6.m128[0] =
           fVar16 * (float)uStack_200 * (float)local_208._0_4_ +
           (float)local_208._4_4_ * (float)local_1f8._0_4_;
      aVar6.m128[2] =
           (1.0 - (float)uStack_200 * (float)uStack_200) * fVar15 +
           (float)uStack_200 * (float)uStack_200;
      aVar6.m128[3] = 0.0;
      (__return_storage_ptr__->l).vz.field_0 = aVar6;
      goto code_r0x0017a172;
    }
    pXVar2 = xml->ptr;
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_y","");
    XML::parm(&local_258,pXVar2,(string *)local_238);
    _Var8._M_p = local_258._M_dataplus._M_p;
    xml = (Ref<embree::XML> *)__errno_location();
    iVar9 = *(int *)&xml->ptr;
    *(int *)&xml->ptr = 0;
    fVar15 = strtof(_Var8._M_p,(char **)&local_1b8);
    local_218._0_4_ = fVar15;
    if (local_1b8._M_dataplus._M_p == _Var8._M_p) goto LAB_0017abc4;
    if (*(int *)&xml->ptr == 0) {
LAB_00179e4d:
      *(int *)&xml->ptr = iVar9;
    }
    else if (*(int *)&xml->ptr == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00179cd8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238);
    }
    fVar15 = (float)local_218._0_4_ * 0.017453292;
    local_218._0_4_ = fVar15;
    auVar19._0_12_ = ZEXT812(0x3f800000);
    auVar19._12_4_ = 0;
    auVar19 = rsqrtss(auVar19,auVar19);
    fVar16 = auVar19._0_4_;
    fVar16 = fVar16 * fVar16 * fVar16 * -0.5 + fVar16 * 1.5;
    local_208._4_4_ = fVar16 * 1.0;
    uStack_200._0_4_ = fVar16 * 0.0;
LAB_0017a043:
    local_208._0_4_ = fVar16 * 0.0;
    uStack_200._4_4_ = fVar16 * 0.0;
  }
  else {
    pXVar2 = xml->ptr;
    local_238 = (undefined1  [8])local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"rotate_x","");
    XML::parm(&local_258,pXVar2,(string *)local_238);
    _Var8._M_p = local_258._M_dataplus._M_p;
    xml = (Ref<embree::XML> *)__errno_location();
    iVar9 = *(int *)&xml->ptr;
    *(int *)&xml->ptr = 0;
    local_218._0_4_ = strtof(_Var8._M_p,(char **)&local_1b8);
    if (local_1b8._M_dataplus._M_p == _Var8._M_p) {
      std::__throw_invalid_argument("stof");
LAB_0017abc4:
      std::__throw_invalid_argument("stof");
LAB_0017abd0:
      std::__throw_invalid_argument("stof");
      goto LAB_0017abdc;
    }
    if (*(int *)&xml->ptr == 0) {
LAB_00179cd8:
      *(int *)&xml->ptr = iVar9;
    }
    else if (*(int *)&xml->ptr == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00179be8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if (local_238 != (undefined1  [8])local_228) {
      operator_delete((void *)local_238);
    }
    fVar15 = (float)local_218._0_4_ * 0.017453292;
    local_218._0_4_ = fVar15;
    auVar18._0_12_ = ZEXT812(0x3f800000);
    auVar18._12_4_ = 0;
    auVar19 = rsqrtss(auVar18,auVar18);
    fVar16 = auVar19._0_4_;
    fVar16 = fVar16 * fVar16 * fVar16 * -0.5 + fVar16 * 1.5;
    local_208._4_4_ = fVar16 * 0.0;
    local_208._0_4_ = fVar16 * 1.0;
    uStack_200._0_4_ = fVar16 * 0.0;
    uStack_200._4_4_ = fVar16 * 0.0;
  }
  local_1f8._0_4_ = sinf(fVar15);
  local_1f8._4_4_ = extraout_XMM0_Db;
  local_1f8._8_4_ = extraout_XMM0_Dc;
  local_1f8._12_4_ = extraout_XMM0_Dd;
  fVar15 = cosf((float)local_218._0_4_);
  aVar22._0_4_ = (1.0 - (float)local_208._0_4_ * (float)local_208._0_4_) * fVar15 +
                 (float)local_208._0_4_ * (float)local_208._0_4_;
  fVar16 = 1.0 - fVar15;
  aVar22.m128[1] =
       (float)local_208._0_4_ * (float)local_208._4_4_ * fVar16 +
       (float)local_1f8._0_4_ * (float)uStack_200;
  aVar22.m128[2] =
       (float)uStack_200 * (float)local_208._0_4_ * fVar16 -
       (float)local_208._4_4_ * (float)local_1f8._0_4_;
  aVar22.m128[3] = 0.0;
  (__return_storage_ptr__->l).vx.field_0 = aVar22;
  aVar3.m128[1] =
       (float)local_208._4_4_ * (float)local_208._4_4_ +
       fVar15 * (1.0 - (float)local_208._4_4_ * (float)local_208._4_4_);
  aVar3.m128[0] =
       fVar16 * (float)local_208._0_4_ * (float)local_208._4_4_ +
       (float)local_1f8._0_4_ * -(float)uStack_200;
  aVar3.m128[2] =
       (float)uStack_200 * (float)local_208._4_4_ * fVar16 +
       (float)local_208._0_4_ * (float)local_1f8._0_4_;
  aVar3.m128[3] = 0.0;
  (__return_storage_ptr__->l).vy.field_0 = aVar3;
  aVar5.m128[1] =
       fVar16 * (float)uStack_200 * (float)local_208._4_4_ +
       -(float)local_208._0_4_ * (float)local_1f8._0_4_;
  aVar5.m128[0] =
       fVar16 * (float)uStack_200 * (float)local_208._0_4_ +
       (float)local_208._4_4_ * (float)local_1f8._0_4_;
  aVar5.m128[2] =
       (1.0 - (float)uStack_200 * (float)uStack_200) * fVar15 +
       (float)uStack_200 * (float)uStack_200;
  aVar5.m128[3] = 0.0;
  (__return_storage_ptr__->l).vz.field_0 = aVar5;
code_r0x0017a172:
  aVar20._0_12_ = ZEXT812(0);
  aVar20.m128[3] = 0.0;
  (__return_storage_ptr__->p).field_0 = aVar20;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa XMLLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->parm("translate") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("translate"));
      return AffineSpace3fa::translate(v);
    } else if (xml->parm("scale") != "") {
      const Vec3f v = string_to_Vec3f(xml->parm("scale"));
      return AffineSpace3fa::scale(v);
    } else if (xml->parm("rotate_x") != "") {
      const float degrees = std::stof(xml->parm("rotate_x"));
      return AffineSpace3fa::rotate(Vec3f(1,0,0),deg2rad(degrees));
    } else if (xml->parm("rotate_y") != "") {
      const float degrees = std::stof(xml->parm("rotate_y"));
      return AffineSpace3fa::rotate(Vec3f(0,1,0),deg2rad(degrees));
    } else if (xml->parm("rotate_z") != "") {
      const float degrees = std::stof(xml->parm("rotate_z"));
      return AffineSpace3fa::rotate(Vec3f(0,0,1),deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "" && xml->parm("point") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      const Vec3f p = string_to_Vec3f(xml->parm("point"));
      return AffineSpace3fa::rotate(p,v,deg2rad(degrees));
    } else if (xml->parm("angle") != "" && xml->parm("axis") != "") {
      const float degrees = std::stof(xml->parm("angle"));
      const Vec3f v = string_to_Vec3f(xml->parm("axis"));
      return AffineSpace3fa::rotate(v,deg2rad(degrees));
    } else {
      if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
      return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                           xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                           xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                            Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
    }
  }